

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

char * ndiCommandVA(ndicapi *api,char *format,__va_list_tag *ap)

{
  byte *__s;
  int iVar1;
  int iVar2;
  _func_void_int_char_ptr_void_ptr *p_Var3;
  long lVar4;
  unsigned_long uVar5;
  char cVar6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  void *pvVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  size_t sVar11;
  bool bVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  int errorCode;
  int errorCode_1;
  bool local_4e;
  bool local_4d;
  uint local_4c;
  char *local_48;
  size_t local_40;
  int local_34;
  
  local_4c = 0;
  __s = (byte *)api->Command;
  pcVar13 = api->Reply;
  pcVar15 = api->ReplyNoCRC;
  api->ErrorCode = 0;
  *__s = 0;
  *pcVar13 = '\0';
  *pcVar15 = '\0';
  iVar2 = api->SerialDevice;
  local_48 = pcVar15;
  if (((iVar2 == -1) && (api->Hostname == (char *)0x0)) && (api->Port < 0)) {
    api->ErrorCode = 0x101;
    p_Var3 = api->ErrorCallback;
    if (p_Var3 == (_func_void_int_char_ptr_void_ptr *)0x0) {
      return pcVar15;
    }
    pvVar10 = api->ErrorCallbackData;
    pcVar13 = "Error opening serial connection";
    iVar2 = 0x101;
    goto LAB_00107804;
  }
  if (format == (char *)0x0) {
    if ((api->IsThreadedMode == true) && (api->IsTracking == true)) {
      ndiMutexLock(api->ThreadMutex);
      iVar2 = api->SerialDevice;
    }
    api->IsTracking = false;
    if (iVar2 == -1) {
      iVar2 = ndiSocketRead(api->Socket,pcVar13,0x7ff,false,&local_34);
    }
    else {
      ndiSerialComm(iVar2,0x2580,"8N1",0);
      ndiSerialFlush(api->SerialDevice,3);
      ndiSerialBreak(api->SerialDevice);
      iVar2 = ndiSerialRead(api->SerialDevice,pcVar13,0x7ff,false,(int *)&local_4c);
    }
    iVar1 = strncmp(pcVar13,"RESETBE6F\r",8);
    if (iVar1 == 0) {
      lVar4 = (long)iVar2;
      pcVar13[lVar4] = '\0';
      strncpy(pcVar15,pcVar13,lVar4 - 5);
      pcVar15[lVar4 + -5] = '\0';
      return local_48;
    }
    api->ErrorCode = 0x106;
    p_Var3 = api->ErrorCallback;
    if (p_Var3 == (_func_void_int_char_ptr_void_ptr *)0x0) {
      return local_48;
    }
    pvVar10 = api->ErrorCallbackData;
    pcVar13 = "Measurement System failed to reset on break";
    iVar2 = 0x106;
    goto LAB_00107804;
  }
  vsprintf((char *)__s,format,ap);
  bVar8 = *__s;
  if (bVar8 == 0) {
    iVar2 = 0;
    uVar18 = 0;
  }
  else {
    bVar19 = true;
    uVar18 = 0;
    uVar16 = 0;
    uVar14 = 0;
    bVar12 = false;
    do {
      bVar7 = (byte)(uVar16 & 0xffff) ^ bVar8;
      uVar16 = (uVar16 & 0xffff) >> 8;
      if (oddparity[bVar7 & 0xf] != oddparity[bVar7 >> 4]) {
        uVar16 = uVar16 ^ 0xffffc001;
      }
      if (((bVar19) && (bVar12 = (bool)(bVar12 | bVar8 == 0x3a), 0x19 < (byte)(bVar8 + 0xbf))) &&
         (9 < (byte)(bVar8 - 0x30))) {
        uVar14 = uVar18 & 0xffffffff;
        bVar19 = false;
      }
      uVar16 = (uint)bVar7 << 7 ^ (uint)bVar7 << 6 ^ uVar16;
      bVar8 = __s[uVar18 + 1];
      uVar18 = uVar18 + 1;
    } while (bVar8 != 0);
    iVar2 = (int)uVar14;
    if (bVar19) {
      iVar2 = (int)uVar18;
    }
    if (bVar12) {
      sprintf((char *)(__s + uVar18),"%04X",(ulong)(uVar16 & 0xffff));
      uVar18 = (ulong)((int)uVar18 + 4);
    }
  }
  iVar17 = (int)uVar18;
  (__s + iVar17)[0] = 0xd;
  (__s + iVar17)[1] = 0;
  sVar11 = (size_t)iVar2;
  iVar1 = strncmp((char *)__s,"BX",sVar11);
  local_4e = true;
  if ((iVar2 != 2 || iVar1 != 0) &&
     (iVar1 = strncmp((char *)__s,"GETLOG",sVar11), iVar2 != 6 || iVar1 != 0)) {
    iVar1 = strncmp((char *)__s,"VGET",sVar11);
    local_4e = iVar2 == 4 && iVar1 == 0;
  }
  bVar19 = api->IsThreadedMode;
  local_40 = sVar11;
  if (bVar19 == true) {
    if ((api->IsTracking != true || iVar2 != 2) ||
       ((((bVar8 = *__s, bVar8 != 0x42 && (bVar8 != 0x54)) && (bVar8 != 0x47)) || (__s[1] != 0x58)))
       ) {
      if (api->IsTracking != false) {
        ndiMutexLock(api->ThreadMutex);
      }
      goto LAB_00107542;
    }
    iVar1 = strcmp((char *)__s,api->ThreadCommand);
    if (iVar1 != 0) {
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand,(char *)__s);
      api->IsThreadedCommandBinary = *__s == 0x42;
      ndiMutexUnlock(api->ThreadMutex);
      iVar1 = ndiEventWait(api->ThreadBufferEvent,5000);
      if (iVar1 == 0) goto LAB_001074ec;
LAB_00107502:
      api->ErrorCode = 0x103;
      p_Var3 = api->ErrorCallback;
      if (p_Var3 == (_func_void_int_char_ptr_void_ptr *)0x0) {
        return local_48;
      }
      pvVar10 = api->ErrorCallbackData;
      pcVar13 = "Device->host communication timeout";
      iVar2 = 0x103;
      goto LAB_00107804;
    }
LAB_001074ec:
    iVar1 = ndiEventWait(api->ThreadBufferEvent,5000);
    if (iVar1 != 0) goto LAB_00107502;
    ndiMutexLock(api->ThreadBufferMutex);
    cVar6 = *api->ThreadBuffer;
    if (cVar6 == '\0') {
      iVar1 = 0;
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        pcVar13[lVar4] = cVar6;
        cVar6 = api->ThreadBuffer[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (cVar6 != '\0');
      iVar1 = (int)lVar4;
    }
    if (local_4e == false) {
      pcVar13[lVar4] = '\0';
    }
    uVar16 = api->ThreadErrorCode;
    local_4c = uVar16;
    ndiMutexUnlock(api->ThreadBufferMutex);
  }
  else {
LAB_00107542:
    if (iVar2 == 4) {
      pcVar15 = "INIT";
LAB_0010758c:
      iVar1 = strncmp((char *)__s,pcVar15,sVar11);
      if (iVar1 == 0) {
        api->IsTracking = false;
      }
    }
    else if (iVar2 == 6) {
      iVar1 = strncmp((char *)__s,"TSTART",sVar11);
      if ((iVar1 == 0) && (api->IsTracking = true, bVar19 != false)) {
        *api->ThreadCommand = '\0';
      }
    }
    else if (iVar2 == 5) {
      pcVar15 = "TSTOP";
      goto LAB_0010758c;
    }
    if (api->SerialDevice == -1) {
      ndiSocketFlush(api->Socket,1);
    }
    else {
      ndiSerialFlush(api->SerialDevice,1);
    }
    if (api->SerialDevice == -1) {
      iVar1 = ndiSocketWrite(api->Socket,(char *)__s,iVar17 + 1);
    }
    else {
      iVar1 = ndiSerialWrite(api->SerialDevice,(char *)__s,iVar17 + 1);
    }
    if (iVar1 < 0) {
      local_4c = 0x104;
LAB_00107630:
      iVar1 = 0;
    }
    else {
      if (iVar1 <= iVar17) {
        local_4c = 0x103;
        goto LAB_00107630;
      }
      iVar1 = 0;
      if (local_4c == 0) {
        if (api->SerialDevice == -1) {
          uVar16 = ndiSocketRead(api->Socket,pcVar13,0x7ff,local_4e,(int *)&local_4c);
        }
        else {
          uVar16 = ndiSerialRead(api->SerialDevice,pcVar13,0x7ff,local_4e,(int *)&local_4c);
        }
        uVar18 = (ulong)uVar16;
        if ((int)uVar16 < 0) {
          local_4c = 0x105;
LAB_00107929:
          uVar18 = 0;
        }
        else if (uVar16 == 0) {
          local_4c = 0x103;
          goto LAB_00107929;
        }
        iVar1 = (int)uVar18;
        if (local_4e == false) {
          pcVar13[uVar18] = '\0';
        }
      }
    }
    uVar16 = local_4c;
    if ((api->IsTracking & bVar19) != 0) {
      ndiMutexUnlock(api->ThreadMutex);
      uVar16 = local_4c;
    }
  }
  sVar11 = local_40;
  pcVar15 = local_48;
  if (uVar16 != 0) {
    api->ErrorCode = uVar16;
    p_Var3 = api->ErrorCallback;
    if (p_Var3 == (_func_void_int_char_ptr_void_ptr *)0x0) {
      return local_48;
    }
    pcVar13 = ndiErrorString(uVar16);
    pvVar10 = api->ErrorCallbackData;
    goto LAB_00107678;
  }
  uVar16 = iVar1 - 5U;
  if (local_4e != false) {
    uVar16 = iVar1 - 2U;
  }
  if (-1 < (int)uVar16) {
    if (uVar16 == 0) {
      uVar16 = 0;
      uVar18 = 0;
    }
    else {
      uVar18 = (ulong)uVar16;
      uVar14 = 0;
      uVar16 = 0;
      do {
        bVar8 = (byte)(uVar16 & 0xffff) ^ pcVar13[uVar14];
        uVar16 = (uVar16 & 0xffff) >> 8;
        if (oddparity[bVar8 & 0xf] != oddparity[bVar8 >> 4]) {
          uVar16 = uVar16 ^ 0xffffc001;
        }
        uVar16 = (uint)bVar8 << 7 ^ (uint)bVar8 << 6 ^ uVar16;
        local_48[uVar14] = pcVar13[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar18 != uVar14);
    }
    if (local_4e == false) {
      local_48[uVar18] = '\0';
      lVar4 = 0;
      uVar18 = 0;
      do {
        cVar6 = pcVar13[lVar4 + (ulong)(iVar1 - 5U)];
        iVar17 = -0x57;
        if (((5 < (byte)(cVar6 + 0x9fU)) && (iVar17 = -0x37, 5 < (byte)(cVar6 + 0xbfU))) &&
           (iVar17 = -0x30, 9 < (byte)(cVar6 - 0x30U))) break;
        uVar18 = uVar18 << 4 | (ulong)(uint)(iVar17 + cVar6);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if (uVar18 == (uVar16 & 0xffff)) goto LAB_00107889;
    }
    else if (*(short *)(pcVar13 + (iVar1 - 2U)) == (short)uVar16) {
LAB_00107889:
      cVar6 = *local_48;
      if ((cVar6 == 'E') && (iVar1 = strncmp(local_48,"ERROR",5), iVar1 == 0)) {
        uVar5 = ndiHexToUnsignedLong(pcVar15 + 5,2);
        uVar16 = (uint)uVar5;
        api->ErrorCode = uVar16;
        p_Var3 = api->ErrorCallback;
        if (p_Var3 == (_func_void_int_char_ptr_void_ptr *)0x0) {
          return local_48;
        }
        pcVar13 = ndiErrorString(uVar16);
        pvVar10 = api->ErrorCallbackData;
LAB_00107678:
        (*p_Var3)(uVar16,pcVar13,pvVar10);
        return local_48;
      }
      bVar8 = *__s;
      if (bVar8 == 0x42) {
        if ((__s[1] == 0x58) && (iVar2 == 2)) {
          anon_unknown.dwarf_ae8::ndiBXHelper(api,(char *)__s,pcVar15);
          return local_48;
        }
LAB_00107988:
        pcVar13 = (char *)(ulong)(iVar2 == 4);
      }
      else {
        if (bVar8 == 0x47) {
          if ((__s[1] == 0x58) && (iVar2 == 2)) {
            anon_unknown.dwarf_ae8::ndiGXHelper(api,(char *)__s,pcVar15);
            return local_48;
          }
          pcVar13 = (char *)(ulong)(iVar2 == 4);
LAB_00107af5:
          cVar9 = (char)pcVar13;
          bVar12 = false;
          bVar19 = false;
          goto LAB_00107b02;
        }
        if (bVar8 == 0x54) {
          if ((__s[1] == 0x58) && (iVar2 == 2)) {
            anon_unknown.dwarf_ae8::ndiTXHelper(api,(char *)__s,pcVar15);
            return local_48;
          }
          goto LAB_00107988;
        }
        pcVar13 = (char *)(ulong)(iVar2 == 4);
        if ((bVar8 == 0x43) && (iVar2 == 4)) {
          iVar1 = strncmp((char *)__s,"COMM",sVar11);
          pcVar13 = (char *)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
          if (iVar1 == 0) {
            anon_unknown.dwarf_ae8::ndiCOMMHelper(api,(char *)__s,pcVar13);
            return local_48;
          }
          goto LAB_00107af5;
        }
      }
      bVar19 = bVar8 == 0x49;
      if ((bVar19) && ((char)pcVar13 != '\0')) {
        pcVar15 = "INIT";
        iVar1 = strncmp((char *)__s,"INIT",sVar11);
        bVar19 = true;
        pcVar13 = (char *)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        if (iVar1 == 0) {
          anon_unknown.dwarf_ae8::ndiINITHelper(api,pcVar15,pcVar13);
          return local_48;
        }
      }
      cVar9 = (char)pcVar13;
      if (((bVar19) && (iVar2 == 5)) && (iVar1 = strncmp((char *)__s,"IRCHK",sVar11), iVar1 == 0)) {
        anon_unknown.dwarf_ae8::ndiIRCHKHelper(api,(char *)__s,local_48);
        return local_48;
      }
      bVar19 = bVar8 == 0x50;
      bVar12 = false;
      if ((bVar19) && (bVar12 = false, iVar2 == 5)) {
        iVar1 = strncmp((char *)__s,"PHINF",sVar11);
        bVar12 = true;
        if (iVar1 == 0) {
          anon_unknown.dwarf_ae8::ndiPHINFHelper(api,(char *)__s,local_48);
          return local_48;
        }
      }
LAB_00107b02:
      local_4d = iVar2 != 5;
      if ((bVar19) && (cVar9 != '\0')) {
        iVar2 = strncmp((char *)__s,"PHRQ",sVar11);
        if (iVar2 == 0) {
          api->PhrqReply[0] = cVar6;
          api->PhrqReply[1] = local_48[1];
          return local_48;
        }
        iVar2 = strncmp((char *)__s,"PHSR",sVar11);
        if (iVar2 == 0) {
          lVar4 = 0;
          do {
            if (local_48[lVar4] < ' ') break;
            api->PhsrReply[lVar4] = local_48[lVar4];
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x502);
          api->PhsrReply[lVar4] = '\0';
          return local_48;
        }
      }
      if (bVar12) {
        iVar2 = strncmp((char *)__s,"PSTAT",sVar11);
        if (iVar2 != 0) {
          return local_48;
        }
        anon_unknown.dwarf_ae8::ndiPSTATHelper(api,(char *)__s,local_48);
        return local_48;
      }
      if (local_4d || bVar8 != 0x53) {
        return local_48;
      }
      iVar2 = strncmp((char *)__s,"SSTAT",sVar11);
      if (iVar2 != 0) {
        return local_48;
      }
      anon_unknown.dwarf_ae8::ndiSSTATHelper(api,(char *)__s,local_48);
      return local_48;
    }
  }
  api->ErrorCode = 0x100;
  p_Var3 = api->ErrorCallback;
  if (p_Var3 == (_func_void_int_char_ptr_void_ptr *)0x0) {
    return local_48;
  }
  pvVar10 = api->ErrorCallbackData;
  pcVar13 = "Bad CRC on reply from Measurement System";
  iVar2 = 0x100;
LAB_00107804:
  (*p_Var3)(iVar2,pcVar13,pvVar10);
  return local_48;
}

Assistant:

ndicapiExport char* ndiCommandVA(ndicapi* api, const char* format, va_list ap)
{
  int i, bytes, commandLength;
  bool useCrc = false;
  bool inCommand = true;
  char* command;
  char* reply;
  char* commandReply;
  int errorCode = 0;

  command = api->Command;       // text sent to ndicapi
  reply = api->Reply;     // text received from ndicapi
  commandReply = api->ReplyNoCRC;   // received text, with CRC hacked off
  commandLength = 0;                  // length of 'command' part of command

  api->ErrorCode = 0;                 // clear error
  command[0] = '\0';
  reply[0] = '\0';
  commandReply[0] = '\0';

  // verify that the serial device was opened
  if (api->SerialDevice == NDI_INVALID_HANDLE && api->Hostname == NULL && api->Port < 0)
  {
    ndiSetError(api, NDI_OPEN_ERROR);
    return commandReply;
  }

  // if the command is NULL, send a break to reset the Measurement System
  if (format == NULL)
  {
    if (api->IsThreadedMode && api->IsTracking)
    {
      // block the tracking thread
      ndiMutexLock(api->ThreadMutex);
    }
    api->IsTracking = false;

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialComm(api->SerialDevice, 9600, "8N1", 0);
      ndiSerialFlush(api->SerialDevice, NDI_IOFLUSH);
      ndiSerialBreak(api->SerialDevice);
      bytes = ndiSerialRead(api->SerialDevice, reply, 2047, false, &errorCode);
    }
    else
    {
      int errorCode;
      bytes = ndiSocketRead(api->Socket, reply, 2047, false, &errorCode);
    }

    // check for correct reply
    if (strncmp(reply, "RESETBE6F\r", 8) != 0)
    {
      ndiSetError(api, NDI_RESET_FAIL);
      return commandReply;
    }

    // terminate the reply string
    reply[bytes] = '\0';
    bytes -= 5;
    strncpy(commandReply, reply, bytes);
    commandReply[bytes] = '\0';

    // return the reply string, minus the CRC
    return commandReply;
  }

  vsprintf(command, format, ap);                    // format parameters

  unsigned short CRC16 = 0;                         // calculate CRC
  for (i = 0; command[i] != '\0'; i++)
  {
    CalcCRC16(command[i], &CRC16);
    if (inCommand && command[i] == ':')             // only use CRC if a ':'
    {
      useCrc = true;                                //  follows the command
    }
    if (inCommand && !((command[i] >= 'A' && command[i] <= 'Z') ||
                       (command[i] >= '0' && command[i] <= '9')))
    {
      inCommand = false;                            // 'command' part has ended
      commandLength = i;                            // command length
    }
  }
  if (inCommand)
  {
    // Command was sent with no ':'
    // Example, ndiCommand("INIT");
    commandLength = i;
  }

  if (useCrc)
  {
    sprintf(&command[i], "%04X", CRC16);            // tack on the CRC
    i += 4;
  }

  command[i++] = '\r';                              // tack on carriage return
  command[i] = '\0';                                // terminate for good luck

  bool isBinary = (strncmp(command, "BX", commandLength) == 0 && commandLength == strlen("BX") ||
                   strncmp(command, "GETLOG", commandLength) == 0 && commandLength == strlen("GETLOG") ||
                   strncmp(command, "VGET", commandLength) == 0 && commandLength == strlen("VGET"));


  // if the command is GX, TX, or BX and thread_mode is on, we copy the reply from
  //  the thread rather than getting it directly from the Measurement System
  if (api->IsThreadedMode && api->IsTracking &&
      commandLength == 2 && (command[0] == 'G' && command[1] == 'X' ||
                             command[0] == 'T' && command[1] == 'X' ||
                             command[0] == 'B' && command[1] == 'X'))
  {
    // check that the thread is sending the GX/BX/TX command that we want
    if (strcmp(command, api->ThreadCommand) != 0)
    {
      // tell thread to start using the new GX/BX/TX command
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand, command);
      api->IsThreadedCommandBinary = (command[0] == 'B');
      ndiMutexUnlock(api->ThreadMutex);
      // wait for the next data record to arrive (we have to throw it away)
      if (ndiEventWait(api->ThreadBufferEvent, 5000))
      {
        ndiSetError(api, NDI_TIMEOUT);
        return commandReply;
      }
    }
    // there is usually no wait, because usually new data is ready
    if (ndiEventWait(api->ThreadBufferEvent, 5000))
    {
      ndiSetError(api, NDI_TIMEOUT);
      return commandReply;
    }
    // copy the thread's reply buffer into the main reply buffer
    ndiMutexLock(api->ThreadBufferMutex);
    for (bytes = 0; api->ThreadBuffer[bytes] != '\0'; bytes++)
    {
      reply[bytes] = api->ThreadBuffer[bytes];
    }
    if (!isBinary)
    {
      reply[bytes] = '\0';   // terminate string
    }
    errorCode = api->ThreadErrorCode;
    ndiMutexUnlock(api->ThreadBufferMutex);

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }
  // if the command is not a GX or thread_mode is not on, then
  //   send the command directly to the Measurement System and get a reply
  else
  {
    bool isThreadMode = api->IsThreadedMode;

    if (isThreadMode && api->IsTracking)
    {
      // block the tracking thread while we slip this command through
      ndiMutexLock(api->ThreadMutex);
    }

    // change pol->tracking if either TSTOP or TSTART is sent
    if ((commandLength == 5 && strncmp(command, "TSTOP", commandLength) == 0) ||
        (commandLength == 4 && strncmp(command, "INIT", commandLength) == 0))
    {
      api->IsTracking = false;
    }
    else if (commandLength == 6 && strncmp(command, "TSTART", commandLength) == 0)
    {
      api->IsTracking = true;
      if (isThreadMode)
      {
        // this will force the thread to wait until the application sends the first GX command
        api->ThreadCommand[0] = '\0';
      }
    }

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      // flush the input buffer, because anything that we haven't read
      //   yet is garbage left over by a previously failed command
      ndiSerialFlush(api->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(api->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      bytes = ndiSerialWrite(api->SerialDevice, command, i);
    }
    else
    {
      bytes = ndiSocketWrite(api->Socket, command, i);
    }
    if (bytes < 0)
    {
      errorCode = NDI_WRITE_ERROR;
    }
    else if (bytes < i)
    {
      errorCode = NDI_TIMEOUT;
    }

    // read the reply from the Measurement System
    bytes = 0;
    if (errorCode == 0)
    {
      if (api->SerialDevice != NDI_INVALID_HANDLE)
      {
        bytes = ndiSerialRead(api->SerialDevice, reply, 2047, isBinary, &errorCode);
      }
      else
      {
        bytes = ndiSocketRead(api->Socket, reply, 2047, isBinary, &errorCode);
      }
      if (bytes < 0)
      {
        errorCode = NDI_READ_ERROR;
        bytes = 0;
      }
      else if (bytes == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      if (!isBinary)
      {
        reply[bytes] = '\0';   // terminate string
      }
    }

    if (isThreadMode & api->IsTracking)
    {
      // unblock the tracking thread
      ndiMutexUnlock(api->ThreadMutex);
    }

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }

  // back up to before the CRC
  if (!isBinary)
  {
    bytes -= 5; // 4 ASCII chars
  }
  else
  {
    bytes -= 2; // 2 bytes (unsigned short)
  }
  if (bytes < 0)
  {
    ndiSetError(api, NDI_BAD_CRC);
    return commandReply;
  }

  // calculate the CRC and copy serial_reply to command_reply
  CRC16 = 0;
  for (i = 0; i < bytes; i++)
  {
    CalcCRC16(reply[i], &CRC16);
    commandReply[i] = reply[i];
  }

  if (!isBinary)
  {
    // terminate command_reply before the CRC
    commandReply[i] = '\0';
  }

  if (errorCode != 0)
  {
    // Any above errors are caught here and returned after the command has had its CRC stripped
    return commandReply;
  }

  if (!isBinary)
  {
    // read and check the CRC value of the reply
    if (CRC16 != ndiHexToUnsignedLong(&reply[bytes], 4))
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }
  else
  {
    unsigned short replyCrc = (unsigned char)reply[bytes + 1] << 8 | (unsigned char)reply[bytes];
    if (replyCrc != CRC16)
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }

  // check for error code
  if (commandReply[0] == 'E' && strncmp(commandReply, "ERROR", 5) == 0)
  {
    ndiSetError(api, ndiHexToUnsignedLong(&commandReply[5], 2));
    return commandReply;
  }

  // special behavior for specific commands
  if (command[0] == 'T' && command[1] == 'X' && commandLength == 2)   // the TX command
  {
    ndiTXHelper(api, command, commandReply);
  }
  else if (command[0] == 'B' && command[1] == 'X' && commandLength == 2)   // the BX command
  {
    ndiBXHelper(api, command, commandReply);
  }
  else if (command[0] == 'G' && command[1] == 'X' && commandLength == 2)   // the GX command
  {
    ndiGXHelper(api, command, commandReply);
  }
  else if (command[0] == 'C' && commandLength == 4 && strncmp(command, "COMM", commandLength) == 0)
  {
    ndiCOMMHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 4 && strncmp(command, "INIT", commandLength) == 0)
  {
    ndiINITHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 5 && strncmp(command, "IRCHK", commandLength) == 0)
  {
    ndiIRCHKHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PHINF", commandLength) == 0)
  {
    ndiPHINFHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHRQ", commandLength) == 0)
  {
    ndiPHRQHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHSR", commandLength) == 0)
  {
    ndiPHSRHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PSTAT", commandLength) == 0)
  {
    ndiPSTATHelper(api, command, commandReply);
  }
  else if (command[0] == 'S' && commandLength == 5 && strncmp(command, "SSTAT", commandLength) == 0)
  {
    ndiSSTATHelper(api, command, commandReply);
  }

  // return the Measurement System reply, but with the CRC hacked off
  return commandReply;
}